

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandit_run_policy.h
# Opt level: O0

bool __thiscall
bandit::detail::bandit_run_policy::should_run
          (bandit_run_policy *this,char *it_name,contextstack_t *contexts)

{
  bool bVar1;
  uint uVar2;
  bool local_3a;
  bool local_39;
  bool skip;
  contextstack_t *contexts_local;
  char *it_name_local;
  bandit_run_policy *this_local;
  
  if ((this->dry_run_ & 1U) == 0) {
    if (((this->break_on_failure_ & 1U) == 0) ||
       (uVar2 = (*(this->super_run_policy)._vptr_run_policy[4])(), (uVar2 & 1) == 0)) {
      bVar1 = has_context_with_hard_skip(this,contexts);
      if (bVar1) {
        this_local._7_1_ = false;
      }
      else {
        bVar1 = has_skip_pattern(this);
        if ((bVar1) || (bVar1 = has_only_pattern(this), bVar1)) {
          bVar1 = has_only_pattern(this);
          if ((!bVar1) || (bVar1 = has_skip_pattern(this), bVar1)) {
            bVar1 = has_skip_pattern(this);
            if ((!bVar1) || (bVar1 = has_only_pattern(this), bVar1)) {
              bVar1 = context_matches_only_pattern(this,contexts);
              if (bVar1) {
                bVar1 = matches_skip_pattern(this,it_name);
                this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
              }
              else {
                this_local._7_1_ = matches_only_pattern(this,it_name);
              }
            }
            else {
              bVar1 = context_matches_skip_pattern(this,contexts);
              local_3a = true;
              if (!bVar1) {
                local_3a = matches_skip_pattern(this,it_name);
              }
              this_local._7_1_ = (bool)((local_3a ^ 0xffU) & 1);
            }
          }
          else {
            bVar1 = context_matches_only_pattern(this,contexts);
            local_39 = true;
            if (!bVar1) {
              local_39 = matches_only_pattern(this,it_name);
            }
            this_local._7_1_ = local_39;
          }
        }
        else {
          this_local._7_1_ = true;
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool should_run(const char* it_name, const contextstack_t& contexts) const
    {
      if(dry_run_)
      {
          return false;
      }

      if(break_on_failure_ && has_encountered_failure())
      {
          return false;
      }

      //
      // Never run if a context has been marked as skip
      // using 'describe_skip'
      //
      if(has_context_with_hard_skip(contexts))
      {
        return false;
      }

      //
      // Always run if no patterns have been specifed
      //
      if(!has_skip_pattern() && !has_only_pattern())
      {
        return true;
      }

      if(has_only_pattern() && !has_skip_pattern())
      {
        return context_matches_only_pattern(contexts)
          || matches_only_pattern(it_name);
      }

      if(has_skip_pattern() && !has_only_pattern())
      {
        bool skip = context_matches_skip_pattern(contexts) ||
          matches_skip_pattern(it_name);
        return !skip;
      }

      //
      // If we've come this far, both 'skip' and 'only'
      // have been specified.
      //
      // If our contexts match 'only' we're still good
      // regardless of whether there's a 'skip' somewhere
      // in the context stack as well.
      if(context_matches_only_pattern(contexts))
      {
        //
        // We can still mark the current 'it' as 'skip'
        // and ignore it. We check that here.
        //
        return !matches_skip_pattern(it_name);
      }

      //
      // If we've gotten this far, the context matches 'skip'
      // We can still run this spec if it is specifically marked
      // as 'only'.
      //
      return matches_only_pattern(it_name);
    }